

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

int assert_hex_eq(char *a,char *b,size_t size_a,size_t size_b,char *testcase,int line)

{
  int iVar1;
  size_t sVar2;
  char *mask;
  ulong uVar3;
  uint uVar4;
  size_t sVar5;
  
  uVar4 = test_counter + 1;
  test_counter = uVar4;
  if ((size_a == size_b) && (iVar1 = bcmp(a,b,size_a), iVar1 == 0)) {
    printf("ok %d - %s...\n",(ulong)uVar4,testcase);
    return 0;
  }
  printf("not ok %d - %s...\n",(ulong)uVar4,testcase);
  printf("# Error on line %d\n",(ulong)(uint)line);
  sVar2 = size_b;
  if (size_a >= size_b && size_a != size_b) {
    sVar2 = size_a;
  }
  sVar5 = size_b;
  if (size_a < size_b) {
    sVar5 = size_a;
  }
  mask = (char *)calloc(1,(long)(int)sVar2);
  if (0 < (int)(uint)sVar5) {
    uVar3 = 0;
    do {
      if (a[uVar3] != b[uVar3]) {
        mask[uVar3] = '\x01';
      }
      uVar3 = uVar3 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar3);
  }
  puts("#");
  puts("# Expected:");
  hexdump(a,mask,size_a);
  puts("#");
  puts("# Observed:");
  hexdump(b,mask,size_b);
  free(mask);
  global_err = global_err + 1;
  return 1;
}

Assistant:

int assert_hex_eq(const char *a, const char *b, size_t size_a, size_t size_b,
                  const char *testcase, int line)
{
    test_counter++;
    int err = (size_a != size_b) || memcmp(a, b, size_a);
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Error on line %d\n", line);
        //printf("# Expected '%s', but observed '%s' instead (line %d)\n", a, b, line);

        //create difference mask
        const int longer  = size_a > size_b ? size_a : size_b;
        const int shorter = size_a < size_b ? size_a : size_b;
        char *mask = (char*)malloc(longer);
        memset(mask, 0, longer);
        for(int i=0; i<shorter; ++i)
            if(a[i] != b[i])
                mask[i] = 1;

        printf("#\n");
        printf("# Expected:\n");
        hexdump(a, mask, size_a);
        printf("#\n");
        printf("# Observed:\n");
        hexdump(b, mask, size_b);
        free(mask);

        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}